

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O3

bool __thiscall Alignment::CalculateEuler(Alignment *this,Matrix3d *C,double *Euler)

{
  double dVar1;
  double dVar2;
  
  dVar1 = atan2((C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[1],(C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                         .m_data.array[0]);
  Euler[2] = dVar1;
  dVar1 = (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar2 = 1.0 - dVar1 * dVar1;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar1 = atan2(-dVar1,dVar2);
  Euler[1] = dVar1;
  dVar1 = atan2((C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[5],(C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                         .m_data.array[8]);
  *Euler = dVar1;
  return true;
}

Assistant:

bool Alignment::CalculateEuler(const Matrix3d C, double* Euler)
{
    Euler[2] = atan2(C(1, 0), C(0, 0));                       // roll
    Euler[1] = atan2(-C(2, 0), sqrt(1 -  C(2, 0) * C(2, 0))); // pitch
    Euler[0] = atan2(C(2, 1), C(2, 2));                       // yaw

    return true;
}